

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econftool.c
# Opt level: O3

econf_file * init_key_file(void)

{
  int iVar1;
  undefined4 extraout_var;
  char *param;
  econf_file *key_file;
  char *local_10;
  econf_file *local_8;
  
  local_8 = (econf_file *)0x0;
  local_10 = (char *)0x0;
  iVar1 = asprintf(&local_10,"PARSING_DIRS=%s:%s",usr_root_dir,root_dir);
  if (iVar1 < 0) {
    init_key_file_cold_2();
  }
  else {
    iVar1 = econf_newKeyFile_with_options(&local_8,local_10);
    if (iVar1 == 0) {
      free(local_10);
      return local_8;
    }
  }
  init_key_file_cold_1();
  printf("Vendor config directory: %s\n",usr_root_dir);
  printf("Config directory for local changes:  %s\n",root_dir);
  printf("Basename: %s\n",conf_basename);
  iVar1 = printf("Suffix: %s\n",conf_suffix);
  return (econf_file *)CONCAT44(extraout_var,iVar1);
}

Assistant:

static econf_file *init_key_file(void)
{
    econf_file *key_file = NULL;
    econf_err error;

    char *param = NULL;
    if (asprintf(&param, "PARSING_DIRS=%s:%s", usr_root_dir, root_dir) < 0) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
    }

    if ((error = econf_newKeyFile_with_options(&key_file, param)))
    {
      fprintf (stderr, "ERROR: couldn't allocate new key_file: %s\n",
	       econf_errString(error));
      free(param);
      exit(EXIT_FAILURE);
    }

    free(param);
    return key_file;
}